

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCxxModuleBmiGenerator.cxx
# Opt level: O1

string * __thiscall
cmInstallCxxModuleBmiGenerator::GetScriptLocation
          (string *__return_storage_ptr__,cmInstallCxxModuleBmiGenerator *this,string *config)

{
  char *__s;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string local_78;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  undefined8 local_48;
  char *local_40;
  size_t local_38;
  char *local_30;
  undefined8 local_28;
  char *local_20;
  
  if (config->_M_string_length == 0) {
    __s = "noconfig";
  }
  else {
    __s = (config->_M_dataplus)._M_p;
  }
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&local_78,this->Target);
  local_58._M_len = local_78._M_string_length;
  local_58._M_str = local_78._M_dataplus._M_p;
  local_48 = 0x18;
  local_40 = "/install-cxx-module-bmi-";
  local_38 = strlen(__s);
  local_28 = 6;
  local_20 = ".cmake";
  views._M_len = 4;
  views._M_array = &local_58;
  local_30 = __s;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallCxxModuleBmiGenerator::GetScriptLocation(
  std::string const& config) const
{
  char const* config_name = config.c_str();
  if (config.empty()) {
    config_name = "noconfig";
  }
  return cmStrCat(this->Target->GetSupportDirectory(),
                  "/install-cxx-module-bmi-", config_name, ".cmake");
}